

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

VP8LRefsCursor * VP8LRefsCursorInit(VP8LRefsCursor *__return_storage_ptr__,VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopy *pPVar2;
  PixOrCopy *pPVar3;
  
  pPVar1 = refs->refs_;
  __return_storage_ptr__->cur_block_ = pPVar1;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    pPVar2 = (PixOrCopy *)0x0;
    pPVar3 = (PixOrCopy *)0x0;
  }
  else {
    pPVar2 = pPVar1->start_;
    pPVar3 = pPVar2 + pPVar1->size_;
  }
  __return_storage_ptr__->cur_pos = pPVar2;
  __return_storage_ptr__->last_pos_ = pPVar3;
  return __return_storage_ptr__;
}

Assistant:

VP8LRefsCursor VP8LRefsCursorInit(const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c;
  c.cur_block_ = refs->refs_;
  if (refs->refs_ != NULL) {
    c.cur_pos = c.cur_block_->start_;
    c.last_pos_ = c.cur_pos + c.cur_block_->size_;
  } else {
    c.cur_pos = NULL;
    c.last_pos_ = NULL;
  }
  return c;
}